

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int hex_to_u64(uint8_t *in,int in_len,uint64_t *out)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  if ((((in_len & 0xfU) == 0) && (in != (uint8_t *)0x0)) && (iVar2 = 0, out != (uint64_t *)0x0)) {
    iVar2 = 1;
    for (lVar3 = 0; lVar3 < in_len; lVar3 = lVar3 + 0x10) {
      hex_to_u8(in + lVar3,0x10,(uint8_t *)out);
      uVar1 = *out;
      *out = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      out = out + 1;
    }
  }
  return iVar2;
}

Assistant:

int hex_to_u64(const uint8_t *in, int in_len, uint64_t *out)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    if (in_len % 16 != 0)
        return GML_ERROR;

    for (int i = 0; i < in_len; i += 16) {
        hex_to_u8(in + i, 16, (uint8_t*)out);
        if (ENDIANESS == ORDER_LITTLE_ENDIAN)
            out[0] = BSWAP8(out[0]);
        out++;
    }

    return GML_OK;
}